

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf_lib.c
# Opt level: O0

CONF * NCONF_new_ex(OSSL_LIB_CTX *libctx,CONF_METHOD *meth)

{
  CONF_METHOD *in_RSI;
  OSSL_LIB_CTX *in_RDI;
  CONF *ret;
  int line;
  CONF *local_8;
  
  if (in_RSI == (CONF_METHOD *)0x0) {
    in_RSI = NCONF_default();
  }
  local_8 = (CONF *)(*in_RSI->create)(in_RSI);
  line = (int)((ulong)in_RSI >> 0x20);
  if (local_8 == (CONF *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,line,(char *)local_8);
    ERR_set_error(0xe,0xc0100,(char *)0x0);
    local_8 = (CONF *)0x0;
  }
  else {
    local_8->libctx = in_RDI;
  }
  return local_8;
}

Assistant:

CONF *NCONF_new_ex(OSSL_LIB_CTX *libctx, CONF_METHOD *meth)
{
    CONF *ret;

    if (meth == NULL)
        meth = NCONF_default();

    ret = meth->create(meth);
    if (ret == NULL) {
        ERR_raise(ERR_LIB_CONF, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    ret->libctx = libctx;

    return ret;
}